

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# nuklear.h
# Opt level: O0

void nk_draw_list_stroke_rect
               (nk_draw_list *list,nk_rect rect,nk_color col,float rounding,float thickness)

{
  nk_vec2 a;
  undefined4 in_ESI;
  long in_RDI;
  undefined8 in_XMM0_Qa;
  nk_vec2 nVar1;
  undefined8 in_XMM1_Qa;
  float in_stack_0000002c;
  float in_stack_00000040;
  long in_stack_ffffffffffffffb0;
  nk_vec2 in_stack_ffffffffffffffb8;
  undefined8 in_stack_ffffffffffffffc0;
  nk_color color;
  char cStack_11;
  float local_10;
  float fStack_c;
  float local_8;
  float fStack_4;
  
  color = SUB84((ulong)in_stack_ffffffffffffffc0 >> 0x20,0);
  if ((in_RDI != 0) && (cStack_11 = (char)((uint)in_ESI >> 0x18), cStack_11 != '\0')) {
    local_10 = (float)in_XMM0_Qa;
    fStack_c = (float)((ulong)in_XMM0_Qa >> 0x20);
    local_8 = (float)in_XMM1_Qa;
    fStack_4 = (float)((ulong)in_XMM1_Qa >> 0x20);
    if (*(int *)(in_RDI + 0xe8) == 1) {
      nk_vec2(local_10,fStack_c);
      nk_vec2(local_10 + local_8,fStack_c + fStack_4);
      a.y = (float)col;
      a.x = in_stack_00000040;
      nk_draw_list_path_rect_to
                ((nk_draw_list *)CONCAT44(rounding,thickness),a,(nk_vec2)list,in_stack_0000002c);
      in_stack_ffffffffffffffb0 = in_RDI;
    }
    else {
      nVar1 = nk_vec2(local_10 - 0.5,fStack_c - 0.5);
      color = (nk_color)nVar1.y;
      in_stack_ffffffffffffffb8 = nk_vec2(local_10 + local_8,fStack_c + fStack_4);
      nVar1.y = (float)col;
      nVar1.x = in_stack_00000040;
      nk_draw_list_path_rect_to
                ((nk_draw_list *)CONCAT44(rounding,thickness),nVar1,(nk_vec2)list,in_stack_0000002c)
      ;
    }
    nk_draw_list_path_stroke
              ((nk_draw_list *)in_stack_ffffffffffffffb8,color,
               (nk_draw_list_stroke)((ulong)in_stack_ffffffffffffffb0 >> 0x20),
               (float)in_stack_ffffffffffffffb0);
  }
  return;
}

Assistant:

NK_API void
nk_draw_list_stroke_rect(struct nk_draw_list *list, struct nk_rect rect,
struct nk_color col, float rounding, float thickness)
{
NK_ASSERT(list);
if (!list || !col.a) return;
if (list->line_AA == NK_ANTI_ALIASING_ON) {
nk_draw_list_path_rect_to(list, nk_vec2(rect.x, rect.y),
nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
} else {
nk_draw_list_path_rect_to(list, nk_vec2(rect.x-0.5f, rect.y-0.5f),
nk_vec2(rect.x + rect.w, rect.y + rect.h), rounding);
} nk_draw_list_path_stroke(list,  col, NK_STROKE_CLOSED, thickness);
}